

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::updateFileNameLabel(QFileDialogPrivate *this)

{
  char cVar1;
  FileMode FVar2;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QFileDialogOptions::isLabelExplicitlySet((DialogLabel)(this->options).value.ptr);
  if (cVar1 == '\0') {
    FVar2 = QFileDialog::fileMode
                      (*(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8
                      );
    if (FVar2 == Directory) {
      s = "Directory:";
    }
    else {
      s = "File &name:";
    }
    QFileDialog::tr((QString *)&QStack_38,s,(char *)0x0,-1);
  }
  else {
    QFileDialogOptions::labelText((DialogLabel)&QStack_38);
  }
  setLabelTextControl(this,FileName,(QString *)&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::updateFileNameLabel()
{
    if (options->isLabelExplicitlySet(QFileDialogOptions::FileName)) {
        setLabelTextControl(QFileDialog::FileName, options->labelText(QFileDialogOptions::FileName));
    } else {
        switch (q_func()->fileMode()) {
        case QFileDialog::Directory:
            setLabelTextControl(QFileDialog::FileName, QFileDialog::tr("Directory:"));
            break;
        default:
            setLabelTextControl(QFileDialog::FileName, QFileDialog::tr("File &name:"));
            break;
        }
    }
}